

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::SubdivMeshNode::SubdivMeshNode
          (SubdivMeshNode *this,Ref<embree::SceneGraph::SubdivMeshNode> *imesh,
          Transformations *spaces)

{
  long *in_RSI;
  undefined8 *in_RDI;
  Transformations *in_stack_00000030;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_00000038;
  Transformations *in_stack_00000070;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_00000078;
  bool in_stack_fffffffffffffdef;
  Node *in_stack_fffffffffffffdf0;
  SubdivMeshNode *this_00;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffffe38;
  vector<float,_std::allocator<float>_> *__x;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffffe40;
  vector<float,_std::allocator<float>_> *this_01;
  
  Node::Node(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef);
  *in_RDI = &PTR__SubdivMeshNode_005f2578;
  in_RDI[0xd] = *(undefined8 *)(*in_RSI + 0x68);
  transformMSMBlurVec3faBuffer(in_stack_00000038,in_stack_00000030);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(in_stack_00000078,in_stack_00000070);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe38);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(*in_RSI + 0x100);
  *(undefined4 *)((long)in_RDI + 0x104) = *(undefined4 *)(*in_RSI + 0x104);
  *(undefined4 *)(in_RDI + 0x21) = *(undefined4 *)(*in_RSI + 0x108);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe38);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::vector
            ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffffe40,
             (vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffffe38);
  this_01 = (vector<float,_std::allocator<float>_> *)(in_RDI + 0x2b);
  std::vector<float,_std::allocator<float>_>::vector
            (this_01,(vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe38);
  __x = (vector<float,_std::allocator<float>_> *)*in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
  std::vector<float,_std::allocator<float>_>::vector(this_01,__x);
  this_00 = (SubdivMeshNode *)(in_RDI + 0x34);
  (this_00->super_Node).super_RefCount._vptr_RefCount = *(_func_int ***)(*in_RSI + 0x1a0);
  if ((this_00->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  *(undefined4 *)(in_RDI + 0x35) = *(undefined4 *)(*in_RSI + 0x1a8);
  zero_pad_arrays(this_00);
  return;
}

Assistant:

SubdivMeshNode (Ref<SceneGraph::SubdivMeshNode> imesh, const Transformations& spaces)
        : Node(true),
        time_range(imesh->time_range),
        positions(transformMSMBlurVec3faBuffer(imesh->positions,spaces)),
        normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
        texcoords(imesh->texcoords),
        position_indices(imesh->position_indices),
        normal_indices(imesh->normal_indices),
        texcoord_indices(imesh->texcoord_indices),
        position_subdiv_mode(imesh->position_subdiv_mode), 
        normal_subdiv_mode(imesh->normal_subdiv_mode),
        texcoord_subdiv_mode(imesh->texcoord_subdiv_mode),
        verticesPerFace(imesh->verticesPerFace),
        holes(imesh->holes),
        edge_creases(imesh->edge_creases),
        edge_crease_weights(imesh->edge_crease_weights),
        vertex_creases(imesh->vertex_creases),
        vertex_crease_weights(imesh->vertex_crease_weights),
        material(imesh->material), 
        tessellationRate(imesh->tessellationRate)
      {
        zero_pad_arrays();
      }